

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

vector<soul::Type,_std::allocator<soul::Type>_> * __thiscall
soul::AST::EndpointDetails::getResolvedDataTypes
          (vector<soul::Type,_std::allocator<soul::Type>_> *__return_storage_ptr__,
          EndpointDetails *this)

{
  bool condition;
  size_t __n;
  Expression *pEVar1;
  value_type local_68;
  pool_ref<soul::AST::Expression> *local_50;
  pool_ref<soul::AST::Expression> *t;
  pool_ref<soul::AST::Expression> *__end2;
  pool_ref<soul::AST::Expression> *__begin2;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *__range2;
  undefined1 local_19;
  EndpointDetails *local_18;
  EndpointDetails *this_local;
  vector<soul::Type,_std::allocator<soul::Type>_> *types;
  
  local_19 = 0;
  local_18 = this;
  this_local = (EndpointDetails *)__return_storage_ptr__;
  std::vector<soul::Type,_std::allocator<soul::Type>_>::vector(__return_storage_ptr__);
  __n = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::size(&this->dataTypes);
  std::vector<soul::Type,_std::allocator<soul::Type>_>::reserve(__return_storage_ptr__,__n);
  __begin2 = (pool_ref<soul::AST::Expression> *)&this->dataTypes;
  __end2 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::begin
                     ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *)__begin2
                     );
  t = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::end
                ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *)__begin2);
  for (; __end2 != t; __end2 = __end2 + 1) {
    local_50 = __end2;
    pEVar1 = pool_ref<soul::AST::Expression>::get(__end2);
    condition = isResolvedAsType(pEVar1);
    checkAssertion(condition,"isResolvedAsType (t.get())","getResolvedDataTypes",0x3e2);
    pEVar1 = pool_ref<soul::AST::Expression>::operator->(local_50);
    (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[5])(&local_68);
    std::vector<soul::Type,_std::allocator<soul::Type>_>::push_back
              (__return_storage_ptr__,&local_68);
    Type::~Type(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Type> getResolvedDataTypes() const
        {
            std::vector<Type> types;
            types.reserve (dataTypes.size());

            for (auto& t : dataTypes)
            {
                SOUL_ASSERT (isResolvedAsType (t.get()));
                types.push_back (t->resolveAsType());
            }

            return types;
        }